

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmLocalGenerator *this_00;
  pointer puVar2;
  cmMakefile *makefile;
  pointer pcVar3;
  size_t __n;
  TargetType TVar4;
  int iVar5;
  string *psVar6;
  pointer ppcVar7;
  string *psVar8;
  string *psVar9;
  pointer puVar10;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string targetName;
  string compiler;
  string fastTarget;
  char *in_stack_ffffffffffffff00;
  string local_d0;
  char *local_b0;
  undefined8 local_a8;
  string local_a0;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CMAKE_MAKE_PROGRAM","");
  psVar6 = cmMakefile::GetRequiredDefinition(mf,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  if ((lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"all","");
    AppendTarget(this,fout,&local_d0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (psVar6->_M_dataplus)._M_p,mf,in_stack_ffffffffffffff00,sourceFileFlags,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"clean","");
    AppendTarget(this,fout,&local_d0,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (psVar6->_M_dataplus)._M_p,mf,in_stack_ffffffffffffff00,sourceFileFlags,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_60 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar7 != local_60) {
      do {
        this_00 = *ppcVar7;
        puVar10 = (this_00->GeneratorTargets).
                  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (this_00->GeneratorTargets).
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_58 = ppcVar7;
        if (puVar10 != puVar2) {
          makefile = this_00->Makefile;
          do {
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((puVar10->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            pcVar3 = (psVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar3,pcVar3 + psVar8->_M_string_length);
            TVar4 = cmGeneratorTarget::GetType
                              ((puVar10->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            if (TVar4 < UTILITY) {
              AppendTarget(this,fout,&local_a0,this_00,
                           (puVar10->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                           (psVar6->_M_dataplus)._M_p,makefile,in_stack_ffffffffffffff00,
                           sourceFileFlags,false);
              local_d0._M_dataplus._M_p = (pointer)local_a0._M_string_length;
              local_d0._M_string_length = (size_type)local_a0._M_dataplus._M_p;
              local_d0.field_2._M_allocated_capacity = 0;
              local_d0.field_2._8_8_ = 5;
              local_b0 = "/fast";
              local_a8 = 0;
              views._M_len = 2;
              views._M_array = (iterator)&local_d0;
              cmCatViews(&local_50,views);
              AppendTarget(this,fout,&local_50,this_00,
                           (puVar10->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                           (psVar6->_M_dataplus)._M_p,makefile,in_stack_ffffffffffffff00,
                           sourceFileFlags,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else if (TVar4 == UTILITY) {
              local_d0._M_dataplus._M_p = (pointer)local_a0._M_string_length;
              local_d0._M_string_length = (size_type)local_a0._M_dataplus._M_p;
              __str._M_str = "Nightly";
              __str._M_len = 7;
              iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_d0,0,7,
                                 __str);
              if ((iVar5 != 0) ||
                 (iVar5 = std::__cxx11::string::compare((char *)&local_a0), iVar5 == 0)) {
                local_d0._M_dataplus._M_p = (pointer)local_a0._M_string_length;
                local_d0._M_string_length = (size_type)local_a0._M_dataplus._M_p;
                __str_00._M_str = "Continuous";
                __str_00._M_len = 10;
                iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_d0,0,
                                   10,__str_00);
                if ((iVar5 != 0) ||
                   (iVar5 = std::__cxx11::string::compare((char *)&local_a0), iVar5 == 0)) {
                  local_d0._M_dataplus._M_p = (pointer)local_a0._M_string_length;
                  local_d0._M_string_length = (size_type)local_a0._M_dataplus._M_p;
                  __str_01._M_str = "Experimental";
                  __str_01._M_len = 0xc;
                  iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_d0,0
                                     ,0xc,__str_01);
                  if (iVar5 == 0) {
                    iVar5 = std::__cxx11::string::compare((char *)&local_a0);
                    goto LAB_004460ca;
                  }
                  goto LAB_004460ce;
                }
              }
            }
            else if (TVar4 == GLOBAL_TARGET) {
              psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
              psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
              __n = psVar8->_M_string_length;
              if (__n == psVar9->_M_string_length) {
                if (__n != 0) {
                  iVar5 = bcmp((psVar8->_M_dataplus)._M_p,(psVar9->_M_dataplus)._M_p,__n);
LAB_004460ca:
                  if (iVar5 != 0) goto LAB_00446137;
                }
LAB_004460ce:
                AppendTarget(this,fout,&local_a0,this_00,(cmGeneratorTarget *)0x0,
                             (psVar6->_M_dataplus)._M_p,makefile,in_stack_ffffffffffffff00,
                             sourceFileFlags,false);
              }
            }
LAB_00446137:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            puVar10 = puVar10 + 1;
          } while (puVar10 != puVar2);
        }
        ppcVar7 = local_58 + 1;
      } while (ppcVar7 != local_60);
    }
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendAllTargets(
  const std::vector<cmLocalGenerator*>& lgs, const cmMakefile* mf,
  cmGeneratedFileStream& fout, MapSourceFileFlags& sourceFileFlags)
{
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler;
  if (!lgs.empty()) {
    this->AppendTarget(fout, "all", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, true);
    this->AppendTarget(fout, "clean", lgs[0], nullptr, make.c_str(), mf,
                       compiler.c_str(), sourceFileFlags, false);
  }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();
    for (const auto& target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                               makefile, compiler.c_str(), sourceFileFlags,
                               false);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, lg, nullptr, make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, lg, target.get(), make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(fout, fastTarget, lg, target.get(), make.c_str(),
                             makefile, compiler.c_str(), sourceFileFlags,
                             false);
        } break;
        default:
          break;
      }
    }
  }
}